

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  ushort uVar1;
  ushort uVar2;
  BCReg maxslot;
  BCReg BVar3;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  int iVar6;
  BCReg BVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  SnapEntry *map;
  uint8_t udf [255];
  uint8_t local_138 [264];
  
  uVar8 = pc[1] >> 8 & 0xff;
  iVar6 = (pc[1] >> 0x10) - 0x8000;
  if (cond == 0) {
    iVar6 = 0;
  }
  pSVar4 = (J->cur).snap;
  uVar11 = (ulong)(J->cur).nsnap;
  uVar1 = pSVar4[uVar11 - 1].mapofs;
  uVar14 = (ulong)pSVar4[uVar11 - 1].nent;
  pSVar5 = (J->cur).snapmap;
  pSVar5[uVar1 + uVar14] = (int)pc + 8 + iVar6 * 4;
  J->needsnap = '\x01';
  if (uVar8 < J->maxslot) {
    J->maxslot = uVar8;
  }
  maxslot = J->maxslot;
  BVar7 = snap_usedef(J,local_138,(BCIns *)(ulong)pSVar5[uVar1 + uVar14],maxslot);
  BVar3 = J->baseslot;
  uVar8 = maxslot + BVar3;
  pSVar4[uVar11 - 1].nslots = (uint8_t)uVar8;
  if (uVar14 == 0) {
    uVar9 = 0;
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    uVar9 = 0;
    do {
      uVar12 = pSVar5[uVar1 + uVar10] >> 0x18;
      if ((uVar12 < BVar7 + BVar3) || ((uVar12 < uVar8 && (local_138[uVar12 - BVar3] == '\0')))) {
        uVar13 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        pSVar5[uVar1 + uVar13] = pSVar5[uVar1 + uVar10];
      }
      uVar10 = uVar10 + 1;
    } while (uVar14 != uVar10);
  }
  pSVar4[uVar11 - 1].nent = (uint8_t)uVar9;
  uVar2 = (J->cur).nsnapmap;
  for (; (uint)uVar10 <= ~(uint)uVar1 + (uint)uVar2; uVar10 = (ulong)((uint)uVar10 + 1)) {
    uVar11 = (ulong)uVar9;
    uVar9 = uVar9 + 1;
    pSVar5[uVar1 + uVar11] = pSVar5[(ulong)uVar1 + (uVar10 & 0xffffffff)];
  }
  (J->cur).nsnapmap = uVar1 + (short)uVar9;
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}